

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * __thiscall
chaiscript::exception::eval_error::format_types_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,Const_Proxy_Function *t_func,
          bool t_dot_notation,Dispatch_Engine *t_ss)

{
  int iVar1;
  AST_Node *pAVar2;
  undefined7 in_register_00000009;
  size_t index;
  long lVar3;
  char *__s;
  long lVar4;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> types;
  string paramstr;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynfun;
  Proxy_Function f;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynfunguard;
  stringstream ss;
  ostream local_1a8 [376];
  
  lVar3 = *(long *)this;
  if (lVar3 == 0) {
    __assert_fail("t_func",
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_common.hpp"
                  ,0x18a,
                  "static std::string chaiscript::exception::eval_error::format_types(const Const_Proxy_Function &, bool, const chaiscript::detail::Dispatch_Engine &)"
                 );
  }
  iVar1 = *(int *)(lVar3 + 0x20);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&types,(vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)
                    (lVar3 + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iVar1 == -1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (__return_storage_ptr__,"(...)");
    if ((char)t_func != '\0') {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     "(Object).",__return_storage_ptr__);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
      std::__cxx11::string::~string((string *)&ss);
    }
  }
  else if ((ulong)(((long)types.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)types.
                         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 2) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (__return_storage_ptr__,"()");
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(local_1a8,"(");
    paramstr._M_dataplus._M_p = (pointer)&paramstr.field_2;
    paramstr._M_string_length = 0;
    paramstr.field_2._M_local_buf[0] = '\0';
    lVar3 = 1;
    lVar4 = 0x18;
    while( true ) {
      if (lVar3 == ((long)types.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)types.
                         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18) break;
      __s = "const ";
      if ((*(byte *)((long)&(types.
                             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_flags + lVar4) & 1) == 0)
      {
        __s = "";
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&paramstr,__s);
      detail::Dispatch_Engine::get_type_name_abi_cxx11_
                ((string *)&dynfun,(Dispatch_Engine *)CONCAT71(in_register_00000009,t_dot_notation),
                 (Type_Info *)
                 ((long)&(types.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_type_info + lVar4));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&paramstr,(string *)&dynfun);
      std::__cxx11::string::~string((string *)&dynfun);
      if (lVar3 == 1 && (char)t_func == '\x01') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&paramstr,").(");
        if ((long)types.
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)types.
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x30) goto LAB_00396208;
      }
      else {
LAB_00396208:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&paramstr,", ");
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x18;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dynfun,
               &paramstr,0,paramstr._M_string_length - 2);
    std::operator<<(local_1a8,(string *)&dynfun);
    std::__cxx11::string::~string((string *)&dynfun);
    std::operator<<(local_1a8,")");
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dynfun);
    std::__cxx11::string::~string((string *)&dynfun);
    std::__cxx11::string::~string((string *)&paramstr);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base_const>
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&dynfun);
  if ((dynfun.
       super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr != (element_type *)0x0) &&
     (((dynfun.
        super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->m_parsenode).super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&f.
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 ,&((dynfun.
                     super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->m_guard).
                   super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                );
    if (f.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      std::
      dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
                ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&dynfunguard);
      if ((dynfunguard.
           super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != (element_type *)0x0) &&
         (((dynfunguard.
            super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->m_parsenode).
          super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        pAVar2 = dispatch::Dynamic_Proxy_Function::get_parse_tree
                           (dynfunguard.
                            super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        AST_Node::pretty_print_abi_cxx11_(&paramstr,pAVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       " : ",&paramstr);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        std::__cxx11::string::~string((string *)&paramstr);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dynfunguard.
                  super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    pAVar2 = dispatch::Dynamic_Proxy_Function::get_parse_tree
                       (dynfun.
                        super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    format_location<chaiscript::AST_Node>(&paramstr,pAVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   "\n          Defined at ",&paramstr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)&paramstr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&f.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dynfun.
              super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&types.
              super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_types(const Const_Proxy_Function &t_func, bool t_dot_notation, const chaiscript::detail::Dispatch_Engine &t_ss) {
        assert(t_func);
        int arity = t_func->get_arity();
        std::vector<Type_Info> types = t_func->get_param_types();

        std::string retval;
        if (arity == -1) {
          retval = "(...)";
          if (t_dot_notation) {
            retval = "(Object)." + retval;
          }
        } else if (types.size() <= 1) {
          retval = "()";
        } else {
          std::stringstream ss;
          ss << "(";

          std::string paramstr;

          for (size_t index = 1; index != types.size(); ++index) {
            paramstr += (types[index].is_const() ? "const " : "");
            paramstr += t_ss.get_type_name(types[index]);

            if (index == 1 && t_dot_notation) {
              paramstr += ").(";
              if (types.size() == 2) {
                paramstr += ", ";
              }
            } else {
              paramstr += ", ";
            }
          }

          ss << paramstr.substr(0, paramstr.size() - 2);

          ss << ")";
          retval = ss.str();
        }

        std::shared_ptr<const dispatch::Dynamic_Proxy_Function> dynfun
            = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_func);

        if (dynfun && dynfun->has_parse_tree()) {
          Proxy_Function f = dynfun->get_guard();

          if (f) {
            auto dynfunguard = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(f);
            if (dynfunguard && dynfunguard->has_parse_tree()) {
              retval += " : " + format_guard(dynfunguard->get_parse_tree());
            }
          }

          retval += "\n          Defined at " + format_location(dynfun->get_parse_tree());
        }

        return retval;
      }